

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O3

bool __thiscall
cmQTWrapCPPCommand::InitialPass
          (cmQTWrapCPPCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  bool bVar4;
  string *__x;
  string *psVar5;
  cmSourceFile *this_00;
  string *psVar6;
  cmSourceFile *this_01;
  char *value;
  string *sourceName;
  string *name;
  ulong uVar7;
  string sourceListValue;
  string no_main_dependency;
  string hname;
  string srcName;
  string newName;
  cmCustomCommandLine commandLine;
  string local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  cmCustomCommandLines commandLines;
  
  uVar7 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  paVar1 = &sourceListValue.field_2;
  sourceListValue._M_dataplus._M_p = (pointer)paVar1;
  if (uVar7 < 0x41) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceListValue,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,&sourceListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p == paVar1) goto LAB_0021b627;
  }
  else {
    pcVar2 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&sourceListValue,"QT_MOC_EXECUTABLE","");
    __x = cmMakefile::GetRequiredDefinition(pcVar2,&sourceListValue);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p != paVar1) {
      operator_delete(sourceListValue._M_dataplus._M_p,
                      sourceListValue.field_2._M_allocated_capacity + 1);
    }
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start + 1;
    psVar5 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,name);
    pcVar3 = (psVar5->_M_dataplus)._M_p;
    sourceListValue._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&sourceListValue,pcVar3,pcVar3 + psVar5->_M_string_length);
    psVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (sourceName = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 2; sourceName != psVar5;
        sourceName = sourceName + 1) {
      this_00 = cmMakefile::GetSource((this->super_cmCommand).Makefile,sourceName,Ambiguous);
      if (this_00 == (cmSourceFile *)0x0) {
LAB_0021b15e:
        cmsys::SystemTools::GetFilenameWithoutLastExtension(&srcName,sourceName);
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
        newName._M_dataplus._M_p = (pointer)&newName.field_2;
        pcVar3 = (psVar6->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&newName,pcVar3,pcVar3 + psVar6->_M_string_length);
        std::__cxx11::string::append((char *)&newName);
        std::__cxx11::string::_M_append((char *)&newName,(ulong)srcName._M_dataplus._M_p);
        std::__cxx11::string::append((char *)&newName);
        this_01 = cmMakefile::GetOrCreateSource
                            ((this->super_cmCommand).Makefile,&newName,true,Ambiguous);
        if (this_00 != (cmSourceFile *)0x0) {
          hname._M_dataplus._M_p = (pointer)&hname.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&hname,"ABSTRACT","");
          no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&no_main_dependency,"ABSTRACT","");
          value = cmSourceFile::GetProperty(this_00,&no_main_dependency);
          cmSourceFile::SetProperty(this_01,&hname,value);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
            operator_delete(no_main_dependency._M_dataplus._M_p,
                            CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                     no_main_dependency.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)hname._M_dataplus._M_p != &hname.field_2) {
            operator_delete(hname._M_dataplus._M_p,
                            CONCAT71(hname.field_2._M_allocated_capacity._1_7_,
                                     hname.field_2._M_local_buf[0]) + 1);
          }
        }
        hname._M_dataplus._M_p = (pointer)&hname.field_2;
        hname._M_string_length = 0;
        hname.field_2._M_local_buf[0] = '\0';
        bVar4 = cmsys::SystemTools::FileIsFullPath(sourceName);
        if (bVar4) {
          std::__cxx11::string::_M_assign((string *)&hname);
        }
        else {
          if ((this_00 == (cmSourceFile *)0x0) || (this_00->IsGenerated != true)) {
            cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
          }
          else {
            cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
          }
          std::__cxx11::string::_M_assign((string *)&hname);
          std::__cxx11::string::append((char *)&hname);
          std::__cxx11::string::_M_append((char *)&hname,(ulong)(sourceName->_M_dataplus)._M_p);
        }
        if (sourceListValue._M_string_length != 0) {
          std::__cxx11::string::append((char *)&sourceListValue);
        }
        std::__cxx11::string::_M_append((char *)&sourceListValue,(ulong)newName._M_dataplus._M_p);
        commandLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        commandLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        commandLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,__x);
        no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&no_main_dependency,"-o","");
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commandLine
                   ,&no_main_dependency);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
          operator_delete(no_main_dependency._M_dataplus._M_p,
                          CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                   no_main_dependency.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,&newName);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&commandLine.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ,&hname);
        commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        commandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::
        emplace_back<cmCustomCommandLine>
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                   (cmCustomCommandLine *)
                   &commandLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  );
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,__x);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&depends,&hname);
        no_main_dependency._M_dataplus._M_p = (pointer)&no_main_dependency.field_2;
        no_main_dependency._M_string_length = 0;
        no_main_dependency.field_2._M_local_buf[0] = '\0';
        pcVar2 = (this->super_cmCommand).Makefile;
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"");
        cmMakefile::AddCustomCommandToOutput
                  (pcVar2,&newName,&depends,&no_main_dependency,&commandLines,"Qt Wrapped File",
                   (char *)0x0,false,true,false,false,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)no_main_dependency._M_dataplus._M_p != &no_main_dependency.field_2) {
          operator_delete(no_main_dependency._M_dataplus._M_p,
                          CONCAT71(no_main_dependency.field_2._M_allocated_capacity._1_7_,
                                   no_main_dependency.field_2._M_local_buf[0]) + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&depends);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
                  (&commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&commandLine.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)hname._M_dataplus._M_p != &hname.field_2) {
          operator_delete(hname._M_dataplus._M_p,
                          CONCAT71(hname.field_2._M_allocated_capacity._1_7_,
                                   hname.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)newName._M_dataplus._M_p != &newName.field_2) {
          operator_delete(newName._M_dataplus._M_p,newName.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)srcName._M_dataplus._M_p != &srcName.field_2) {
          operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        srcName._M_dataplus._M_p = (pointer)&srcName.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&srcName,"WRAP_EXCLUDE","");
        bVar4 = cmSourceFile::GetPropertyAsBool(this_00,&srcName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)srcName._M_dataplus._M_p != &srcName.field_2) {
          operator_delete(srcName._M_dataplus._M_p,srcName.field_2._M_allocated_capacity + 1);
        }
        if (!bVar4) goto LAB_0021b15e;
      }
    }
    cmMakefile::AddDefinition
              ((this->super_cmCommand).Makefile,name,sourceListValue._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sourceListValue._M_dataplus._M_p == &sourceListValue.field_2) goto LAB_0021b627;
  }
  operator_delete(sourceListValue._M_dataplus._M_p,sourceListValue.field_2._M_allocated_capacity + 1
                 );
LAB_0021b627:
  return 0x40 < uVar7;
}

Assistant:

bool cmQTWrapCPPCommand::InitialPass(std::vector<std::string> const& args,
                                     cmExecutionStatus&)
{
  if (args.size() < 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // Get the moc executable to run in the custom command.
  std::string const& moc_exe =
    this->Makefile->GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue = this->Makefile->GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(2)) {
    cmSourceFile* curr = this->Makefile->GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string newName = this->Makefile->GetCurrentBinaryDirectory();
      newName += "/moc_";
      newName += srcName;
      newName += ".cxx";
      cmSourceFile* sf = this->Makefile->GetOrCreateSource(newName, true);
      if (curr) {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
      }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if (cmSystemTools::FileIsFullPath(arg)) {
        hname = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          hname = this->Makefile->GetCurrentBinaryDirectory();
        } else {
          hname = this->Makefile->GetCurrentSourceDirectory();
        }
        hname += "/";
        hname += arg;
      }

      // Append the generated source file to the list.
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLine commandLine;
      commandLine.push_back(moc_exe);
      commandLine.push_back("-o");
      commandLine.push_back(newName);
      commandLine.push_back(hname);

      cmCustomCommandLines commandLines;
      commandLines.push_back(std::move(commandLine));

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      std::string no_main_dependency;
      const char* no_working_dir = nullptr;
      this->Makefile->AddCustomCommandToOutput(
        newName, depends, no_main_dependency, commandLines, "Qt Wrapped File",
        no_working_dir);
    }
  }

  // Store the final list of source files.
  this->Makefile->AddDefinition(sourceList, sourceListValue.c_str());
  return true;
}